

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

key_encoder * __thiscall unodb::key_encoder::encode(key_encoder *this,int32_t v)

{
  key_encoder *pkVar1;
  uint32_t local_2c;
  uint32_t u;
  uint32_t u_one;
  int32_t i_one;
  int32_t v_local;
  key_encoder *this_local;
  
  local_2c = v + 0x80000000;
  pkVar1 = encode(this,local_2c);
  return pkVar1;
}

Assistant:

key_encoder &encode(std::int32_t v) {
    constexpr int32_t i_one = 1;
    constexpr uint32_t u_one = static_cast<uint32_t>(1);
    const uint32_t u =
        (v >= 0) ? msb32 + static_cast<uint32_t>(v)
                 : msb32 - static_cast<uint32_t>(-(v + i_one)) - u_one;
    return encode(u);
  }